

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastShiftLeftInt
               (Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
               Vec_Int_t *vRes)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int local_60;
  
  vRes->nSize = 0;
  if (0 < nNum) {
    uVar5 = 0;
    do {
      Vec_IntPush(vRes,pNum[uVar5]);
      uVar5 = uVar5 + 1;
    } while ((uint)nNum != uVar5);
  }
  if (fSticky == 0) {
    local_60 = 0;
  }
  else {
    local_60 = *pNum;
  }
  if (nShift < 0x21) {
    if (0 < nShift) {
      piVar1 = vRes->pArray;
      uVar5 = 0;
      bVar2 = false;
      do {
        if (fSticky < nNum) {
          iVar3 = 1 << ((byte)uVar5 & 0x1f);
          lVar6 = (long)nNum;
          do {
            if ((bVar2) || (lVar6 <= iVar3)) {
              iVar4 = Gia_ManHashMux(pNew,pShift[uVar5],local_60,piVar1[lVar6 + -1]);
              piVar1[lVar6 + -1] = iVar4;
              if (nNum < iVar3) {
                bVar2 = true;
              }
            }
            else {
              iVar4 = Gia_ManHashMux(pNew,pShift[uVar5],piVar1[(lVar6 + -1) - (long)iVar3],
                                     piVar1[lVar6 + -1]);
              piVar1[lVar6 + -1] = iVar4;
              bVar2 = false;
            }
            lVar6 = lVar6 + -1;
          } while (fSticky < lVar6);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)nShift);
    }
    return;
  }
  __assert_fail("nShift <= 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0xc1,
                "void Wlc_BlastShiftLeftInt(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)")
  ;
}

Assistant:

void Wlc_BlastShiftLeftInt( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int * pRes = Wlc_VecCopy( vRes, pNum, nNum );
    int Fill = fSticky ? pNum[0] : 0;
    int i, j, fShort = 0;
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++ ) 
        for( j = nNum-1; j >= fSticky; j-- ) 
        {
            if( fShort || (1<<i) > j ) 
            {
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], Fill, pRes[j] );
                if ( (1<<i) > nNum ) 
                    fShort = 1;
            } 
            else 
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], pRes[j-(1<<i)], pRes[j] );
        }
}